

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O0

void read_bytes<int,int>(vector<int,_std::allocator<int>_> *vec,size_t n_els,char **in,
                        vector<char,_std::allocator<char>_> *buffer,bool diff_endian)

{
  byte bVar1;
  vector<int,_std::allocator<int>_> *in_RCX;
  byte in_R8B;
  undefined7 in_stack_ffffffffffffffd8;
  
  bVar1 = in_R8B & 1;
  read_bytes<int>(in_RCX,CONCAT17(in_R8B,in_stack_ffffffffffffffd8) & 0x1ffffffffffffff,
                  (char **)0x669bf5);
  if ((bVar1 & 1) != 0) {
    std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x669c06);
    swap_endianness<int>((int *)in_RCX,CONCAT17(bVar1,in_stack_ffffffffffffffd8));
  }
  return;
}

Assistant:

void read_bytes(std::vector<dtype> &vec, const size_t n_els, const char *&in, std::vector<char> &buffer, const bool diff_endian)
{
    if (std::is_same<dtype, saved_type>::value)
    {
        read_bytes<dtype>(vec, n_els, in);
        if (unlikely(diff_endian)) swap_endianness(vec.data(), n_els);
        return;
    }
    if (n_els) {
        if (unlikely(buffer.size() < n_els * sizeof(saved_type)))
            buffer.resize((size_t)2 * n_els * sizeof(saved_type));
        read_bytes<saved_type>(buffer.data(), n_els, in);
        vec.resize(n_els);
        vec.shrink_to_fit();
        
        if (unlikely(diff_endian)) swap_endianness((saved_type*)buffer.data(), n_els);
        convert_dtype<dtype, saved_type>(vec.data(), buffer, n_els);
    }
    
    else {
        vec.clear();
        vec.shrink_to_fit();
    }

    in += n_els * sizeof(saved_type);
}